

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

double interpolate_linear(double *xin,double *yin,int N,double z)

{
  double *pdVar1;
  int iVar2;
  double *__ptr;
  undefined8 *__ptr_00;
  int *pos_00;
  double yhi;
  double ylo;
  double out;
  int *pos;
  double *y;
  double *x;
  int local_38;
  int k;
  int j;
  int i;
  double z_local;
  int N_local;
  double *yin_local;
  double *xin_local;
  
  __ptr = (double *)malloc((long)N << 3);
  __ptr_00 = (undefined8 *)malloc((long)N << 3);
  pos_00 = (int *)malloc((long)N << 2);
  sort1d_ascending(xin,N,pos_00);
  for (k = 0; k < N; k = k + 1) {
    __ptr[k] = xin[pos_00[k]];
    __ptr_00[k] = yin[pos_00[k]];
  }
  pdVar1 = (double *)*__ptr_00;
  xin_local = (double *)__ptr_00[N + -1];
  k = 0;
  if (*__ptr <= z) {
    local_38 = N + -1;
    iVar2 = k;
    if (z < __ptr[N + -1] || z == __ptr[N + -1]) {
      while (k = iVar2, k < local_38 + -1) {
        iVar2 = (k + local_38) / 2;
        if (z < __ptr[iVar2]) {
          local_38 = iVar2;
          iVar2 = k;
        }
      }
      if ((z != __ptr[local_38]) || (NAN(z) || NAN(__ptr[local_38]))) {
        if ((z != __ptr[k]) || (NAN(z) || NAN(__ptr[k]))) {
          xin_local = (double *)
                      (((double)__ptr_00[local_38] - (double)__ptr_00[k]) *
                       ((z - __ptr[k]) / (__ptr[local_38] - __ptr[k])) + (double)__ptr_00[k]);
          free(__ptr);
          free(__ptr_00);
          free(pos_00);
        }
        else {
          xin_local = (double *)__ptr_00[k];
          free(__ptr);
          free(__ptr_00);
          free(pos_00);
        }
      }
      else {
        xin_local = (double *)__ptr_00[local_38];
        free(__ptr);
        free(__ptr_00);
        free(pos_00);
      }
    }
    else {
      free(__ptr);
      free(__ptr_00);
      free(pos_00);
    }
  }
  else {
    free(__ptr);
    free(__ptr_00);
    free(pos_00);
    xin_local = pdVar1;
  }
  return (double)xin_local;
}

Assistant:

double interpolate_linear(double *xin,double *yin, int N, double z) {
	int i,j,k;
	double *x,*y;
	int *pos;
	double out,ylo,yhi;

	x = (double*)malloc(sizeof(double)*N);
	y = (double*)malloc(sizeof(double)*N);
	pos = (int*)malloc(sizeof(int)*N);

	sort1d_ascending(xin,N,pos);

	for(i = 0; i < N;++i) {
		x[i] = xin[pos[i]];
		y[i] = yin[pos[i]];
	}

	ylo= y[0];
	yhi = y[N-1];

	i = 0;
	j = N - 1;

	if (z < x[0]) {
		free(x);
		free(y);
		free(pos);
		return ylo;
	}

	if (z > x[j]) {
		free(x);
		free(y);
		free(pos);
		return yhi;
	}

	while (i < j-1) {
		k = (i + j)/2;
		if (z < x[k]) {
			j = k;
		} else {
			i = k;
		}
	}

	if (z == x[j]) {
		out = y[j];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	if (z == x[i]) {
		out = y[i];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	out = y[i] + (y[j] - y[i])* ((z - x[i])/(x[j] - x[i]));

	free(x);
	free(y);
	free(pos);

	return out;
}